

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O2

void erkStep_Free(ARKodeMem ark_mem)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  sunindextype Blrw;
  sunindextype Bliw;
  long local_30;
  long local_28;
  
  if ((ark_mem != (ARKodeMem)0x0) && (pvVar1 = ark_mem->step_mem, pvVar1 != (void *)0x0)) {
    if (*(ARKodeButcherTable *)((long)pvVar1 + 0x20) != (ARKodeButcherTable)0x0) {
      ARKodeButcherTable_Space(*(ARKodeButcherTable *)((long)pvVar1 + 0x20),&local_28,&local_30);
      ARKodeButcherTable_Free(*(ARKodeButcherTable *)((long)pvVar1 + 0x20));
      *(undefined8 *)((long)pvVar1 + 0x20) = 0;
      ark_mem->liw = ark_mem->liw - local_28;
      ark_mem->lrw = ark_mem->lrw - local_30;
    }
    if (*(long *)((long)pvVar1 + 8) != 0) {
      lVar2 = 0;
      for (lVar3 = 0; lVar3 < *(int *)((long)pvVar1 + 0x18); lVar3 = lVar3 + 1) {
        arkFreeVec(ark_mem,(N_Vector *)((long)*(void **)((long)pvVar1 + 8) + lVar2));
        lVar2 = lVar2 + 8;
      }
      free(*(void **)((long)pvVar1 + 8));
      *(undefined8 *)((long)pvVar1 + 8) = 0;
      ark_mem->liw = ark_mem->liw - (long)*(int *)((long)pvVar1 + 0x18);
    }
    if (*(void **)((long)pvVar1 + 0x30) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x30));
      *(undefined8 *)((long)pvVar1 + 0x30) = 0;
      ark_mem->lrw = ark_mem->lrw + ~(long)*(int *)((long)pvVar1 + 0x18);
    }
    if (*(void **)((long)pvVar1 + 0x38) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x38));
      *(undefined8 *)((long)pvVar1 + 0x38) = 0;
      ark_mem->liw = ark_mem->liw + ~(long)*(int *)((long)pvVar1 + 0x18);
    }
    free(ark_mem->step_mem);
    ark_mem->step_mem = (void *)0x0;
  }
  return;
}

Assistant:

void erkStep_Free(ARKodeMem ark_mem)
{
  int j;
  sunindextype Bliw, Blrw;
  ARKodeERKStepMem step_mem;

  /* nothing to do if ark_mem is already NULL */
  if (ark_mem == NULL) { return; }

  /* conditional frees on non-NULL ERKStep module */
  if (ark_mem->step_mem != NULL)
  {
    step_mem = (ARKodeERKStepMem)ark_mem->step_mem;

    /* free the Butcher table */
    if (step_mem->B != NULL)
    {
      ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
      ARKodeButcherTable_Free(step_mem->B);
      step_mem->B = NULL;
      ark_mem->liw -= Bliw;
      ark_mem->lrw -= Blrw;
    }

    /* free the RHS vectors */
    if (step_mem->F != NULL)
    {
      for (j = 0; j < step_mem->stages; j++)
      {
        arkFreeVec(ark_mem, &step_mem->F[j]);
      }
      free(step_mem->F);
      step_mem->F = NULL;
      ark_mem->liw -= step_mem->stages;
    }

    /* free the reusable arrays for fused vector interface */
    if (step_mem->cvals != NULL)
    {
      free(step_mem->cvals);
      step_mem->cvals = NULL;
      ark_mem->lrw -= (step_mem->stages + 1);
    }
    if (step_mem->Xvecs != NULL)
    {
      free(step_mem->Xvecs);
      step_mem->Xvecs = NULL;
      ark_mem->liw -= (step_mem->stages + 1);
    }

    /* free the time stepper module itself */
    free(ark_mem->step_mem);
    ark_mem->step_mem = NULL;
  }
}